

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

int Saig_ManCexVerifyUsingTernary(Aig_Man_t *pAig,Abc_Cex_t *pCex,Abc_Cex_t *pCare)

{
  void *pvVar1;
  ulong uVar2;
  void *pvVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  
  if (pCex->iFrame != pCare->iFrame) {
    __assert_fail("pCex->iFrame == pCare->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28b,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  if (pCex->nBits != pCare->nBits) {
    __assert_fail("pCex->nBits == pCare->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28c,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  if (pAig->nTruePos <= pCex->iPo) {
    __assert_fail("pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x28d,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  *(ulong *)&pAig->pConst1->field_0x18 =
       *(ulong *)&pAig->pConst1->field_0x18 & 0xffffffffffffffcf | 0x20;
  if (0 < pAig->nRegs) {
    iVar5 = 0;
    do {
      uVar6 = pAig->nTruePis + iVar5;
      if (((int)uVar6 < 0) || (pAig->vCis->nSize <= (int)uVar6)) goto LAB_006129b9;
      if ((pCex[1].iPo & 1) != 0) {
        __assert_fail("!Abc_InfoHasBit(pCex->pData, iBit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                      ,0x292,
                      "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
      }
      if ((pCare[1].iPo & 1) != 0) {
        __assert_fail("!Abc_InfoHasBit(pCare->pData, iBit)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                      ,0x293,
                      "int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)");
      }
      pvVar1 = pAig->vCis->pArray[uVar6];
      *(ulong *)((long)pvVar1 + 0x18) = *(ulong *)((long)pvVar1 + 0x18) & 0xffffffffffffffcf | 0x10;
      iVar5 = iVar5 + 1;
    } while (iVar5 < pAig->nRegs);
  }
  uVar6 = pCex->nRegs;
  if (-1 < pCex->iFrame) {
    iVar5 = 0;
    do {
      if (0 < pAig->nTruePis) {
        lVar9 = 0;
        do {
          if (pAig->vCis->nSize <= lVar9) goto LAB_006129b9;
          pvVar1 = pAig->vCis->pArray[lVar9];
          uVar11 = (uint)((ulong)uVar6 + lVar9);
          iVar8 = (int)uVar11 >> 5;
          if (((uint)(&pCare[1].iPo)[iVar8] >> (uVar11 & 0x1f) & 1) == 0) {
            *(byte *)((long)pvVar1 + 0x18) = *(byte *)((long)pvVar1 + 0x18) | 0x30;
          }
          else {
            uVar7 = *(ulong *)((long)pvVar1 + 0x18) & 0xffffffffffffffcf;
            if (((&pCex[1].iPo)[iVar8] & 1 << ((byte)((ulong)uVar6 + lVar9) & 0x1f)) == 0) {
              uVar7 = uVar7 | 0x10;
            }
            else {
              uVar7 = uVar7 | 0x20;
            }
            *(ulong *)((long)pvVar1 + 0x18) = uVar7;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pAig->nTruePis);
        uVar6 = uVar6 + (int)lVar9;
      }
      pVVar10 = pAig->vObjs;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          pvVar1 = pVVar10->pArray[lVar9];
          if (pvVar1 != (void *)0x0) {
            uVar7 = *(ulong *)((long)pvVar1 + 0x18);
            if (0xfffffffd < ((uint)uVar7 & 7) - 7) {
              uVar11 = (uint)uVar7 & 7;
              if (uVar11 == 3) {
                uVar12 = *(ulong *)((long)pvVar1 + 8);
                uVar11 = (uint)*(undefined8 *)((uVar12 & 0xfffffffffffffffe) + 0x18) & 0x30;
                if (((uVar12 & 1) != 0) && (uVar11 == 0x20)) {
LAB_00612742:
                  uVar7 = uVar7 & 0xffffffffffffffcb;
                  goto LAB_00612746;
                }
                if (uVar11 == 0x20) {
                  if ((uVar12 & 1) == 0) {
LAB_0061279c:
                    uVar7 = uVar7 & 0xffffffffffffffcb;
                    goto LAB_006127a0;
                  }
                }
                else if (uVar11 == 0x10) {
                  if ((uVar12 & 1) != 0) goto LAB_0061279c;
                  goto LAB_00612742;
                }
LAB_006127a6:
                uVar7 = uVar7 | 0x30;
              }
              else {
                if (uVar11 != 5) goto LAB_006129d8;
                uVar12 = *(ulong *)((long)pvVar1 + 8);
                uVar11 = (uint)*(undefined8 *)((uVar12 & 0xfffffffffffffffe) + 0x18) & 0x30;
                if (uVar11 != ((uint)uVar12 & 1) * 0x10 + 0x10) {
                  uVar2 = *(ulong *)((long)pvVar1 + 0x10);
                  uVar13 = (uint)*(undefined8 *)((uVar2 & 0xfffffffffffffffe) + 0x18) & 0x30;
                  if (uVar13 != ((uint)uVar2 & 1) * 0x10 + 0x10) {
                    if ((uVar11 != (uint)((uVar12 & 1) == 0) * 0x10 + 0x10) ||
                       (uVar13 != (uint)((uVar2 & 1) == 0) * 0x10 + 0x10)) goto LAB_006127a6;
                    uVar7 = uVar7 & 0xffffffffffffffcd;
LAB_006127a0:
                    uVar7 = uVar7 | 0x20;
                    goto LAB_006127aa;
                  }
                }
                uVar7 = uVar7 & 0xffffffffffffffcd;
LAB_00612746:
                uVar7 = uVar7 | 0x10;
              }
LAB_006127aa:
              *(ulong *)((long)pvVar1 + 0x18) = uVar7;
              pVVar10 = pAig->vObjs;
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar10->nSize);
      }
      pVVar10 = pAig->vCos;
      if (0 < pVVar10->nSize) {
        lVar9 = 0;
        do {
          pvVar1 = pVVar10->pArray[lVar9];
          uVar7 = *(ulong *)((long)pvVar1 + 0x18);
          uVar11 = (uint)uVar7 & 7;
          if (uVar11 == 3) {
            uVar12 = *(ulong *)((long)pvVar1 + 8);
            uVar11 = (uint)*(undefined8 *)((uVar12 & 0xfffffffffffffffe) + 0x18) & 0x30;
            if (((uVar12 & 1) != 0) && (uVar11 == 0x20)) {
LAB_00612867:
              uVar7 = uVar7 & 0xffffffffffffffcb;
              goto LAB_0061286b;
            }
            if (uVar11 == 0x20) {
              if ((uVar12 & 1) == 0) {
LAB_006128c1:
                uVar7 = uVar7 & 0xffffffffffffffcb;
                goto LAB_006128c5;
              }
            }
            else if (uVar11 == 0x10) {
              if ((uVar12 & 1) != 0) goto LAB_006128c1;
              goto LAB_00612867;
            }
LAB_006128cb:
            uVar7 = uVar7 | 0x30;
          }
          else {
            if (uVar11 != 5) {
LAB_006129d8:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                            ,0x26e,"void Saig_ObjCexMinSim(Aig_Obj_t *)");
            }
            uVar12 = *(ulong *)((long)pvVar1 + 8);
            uVar11 = (uint)*(undefined8 *)((uVar12 & 0xfffffffffffffffe) + 0x18) & 0x30;
            if (uVar11 != ((uint)uVar12 & 1) * 0x10 + 0x10) {
              uVar2 = *(ulong *)((long)pvVar1 + 0x10);
              uVar13 = (uint)*(undefined8 *)((uVar2 & 0xfffffffffffffffe) + 0x18) & 0x30;
              if (uVar13 != ((uint)uVar2 & 1) * 0x10 + 0x10) {
                if ((uVar11 != (uint)((uVar12 & 1) == 0) * 0x10 + 0x10) ||
                   (uVar13 != (uint)((uVar2 & 1) == 0) * 0x10 + 0x10)) goto LAB_006128cb;
                uVar7 = uVar7 & 0xffffffffffffffcd;
LAB_006128c5:
                uVar7 = uVar7 | 0x20;
                goto LAB_006128cf;
              }
            }
            uVar7 = uVar7 & 0xffffffffffffffcd;
LAB_0061286b:
            uVar7 = uVar7 | 0x10;
          }
LAB_006128cf:
          *(ulong *)((long)pvVar1 + 0x18) = uVar7;
          lVar9 = lVar9 + 1;
          pVVar10 = pAig->vCos;
        } while (lVar9 < pVVar10->nSize);
      }
      if (0 < pAig->nRegs) {
        iVar8 = 0;
        do {
          uVar11 = pAig->nTruePos + iVar8;
          if (((((int)uVar11 < 0) || (pAig->vCos->nSize <= (int)uVar11)) ||
              (uVar13 = pAig->nTruePis + iVar8, (int)uVar13 < 0)) ||
             (pAig->vCis->nSize <= (int)uVar13)) goto LAB_006129b9;
          pvVar1 = pAig->vCos->pArray[uVar11];
          pvVar3 = pAig->vCis->pArray[uVar13];
          uVar12 = (ulong)((uint)*(undefined8 *)((long)pvVar1 + 0x18) & 0x10);
          uVar7 = *(ulong *)((long)pvVar3 + 0x18);
          *(ulong *)((long)pvVar3 + 0x18) = uVar7 & 0xffffffffffffffef | uVar12;
          *(ulong *)((long)pvVar3 + 0x18) =
               uVar7 & 0xffffffffffffffcf | uVar12 |
               (ulong)((uint)*(undefined8 *)((long)pvVar1 + 0x18) & 0x20);
          iVar8 = iVar8 + 1;
        } while (iVar8 < pAig->nRegs);
      }
      bVar4 = iVar5 < pCex->iFrame;
      iVar5 = iVar5 + 1;
    } while (bVar4);
  }
  if (uVar6 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldCex.c"
                  ,0x2bd,"int Saig_ManCexVerifyUsingTernary(Aig_Man_t *, Abc_Cex_t *, Abc_Cex_t *)")
    ;
  }
  iVar5 = pCex->iPo;
  if ((-1 < (long)iVar5) && (iVar5 < pAig->vCos->nSize)) {
    uVar7 = *(ulong *)((long)pAig->vCos->pArray[iVar5] + 0x18);
    return (uint)((uVar7 & 0x10) == 0) & (uint)(uVar7 >> 5) & 0x7ffffff;
  }
LAB_006129b9:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Saig_ManCexVerifyUsingTernary( Aig_Man_t * pAig, Abc_Cex_t * pCex, Abc_Cex_t * pCare )
{
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f, iBit = 0;
    assert( pCex->iFrame == pCare->iFrame );
    assert( pCex->nBits  == pCare->nBits );
    assert( pCex->iPo < Saig_ManPoNum(pAig) );
    Saig_ObjCexMinSet1( Aig_ManConst1(pAig) );
    // set flops to the init state
    Saig_ManForEachLo( pAig, pObj, i )
    {
        assert( !Abc_InfoHasBit(pCex->pData, iBit) );
        assert( !Abc_InfoHasBit(pCare->pData, iBit) );
//        if ( Abc_InfoHasBit(pCare->pData, iBit++) )
            Saig_ObjCexMinSet0( pObj );
//        else
//            Saig_ObjCexMinSetX( pObj );
    }
    iBit = pCex->nRegs;
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // init inputs
        Saig_ManForEachPi( pAig, pObj, i )
        {
            if ( Abc_InfoHasBit(pCare->pData, iBit++) )
            {
                if ( Abc_InfoHasBit(pCex->pData, iBit-1) )
                    Saig_ObjCexMinSet1( pObj );
                else
                    Saig_ObjCexMinSet0( pObj );
            }
            else
                Saig_ObjCexMinSetX( pObj );
        }
        // simulate internal nodes
        Aig_ManForEachNode( pAig, pObj, i )
            Saig_ObjCexMinSim( pObj );
        // simulate COs
        Aig_ManForEachCo( pAig, pObj, i )
            Saig_ObjCexMinSim( pObj );
/*
        Aig_ManForEachObj( pAig, pObj, i )
        {
            Aig_ObjPrint(pAig, pObj);
            printf( "  Value = " );
            Saig_ObjCexMinPrint( pObj );
            printf( "\n" );
        }
*/
        // transfer
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, i )
            pObjRo->fMarkA = pObjRi->fMarkA,
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == pCex->nBits );
    return Saig_ObjCexMinGet1( Aig_ManCo( pAig, pCex->iPo ) );
}